

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (value_type *__return_storage_ptr__,void *this,char (*v) [2])

{
  char cVar1;
  allocator local_71;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  undefined8 uStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  string local_30 [32];
  
  cVar1 = *this;
  if (cVar1 == '\x01') {
    std::__cxx11::string::string(local_30,(string *)((long)this + 8));
  }
  else {
    std::__cxx11::string::string((string *)&local_70,*v,&local_71);
    local_50 = local_40;
    if (local_70 == local_60) {
      uStack_38 = uStack_58;
    }
    else {
      local_50 = local_70;
    }
    local_48 = local_68;
    local_68 = 0;
    local_60[0] = 0;
    local_70 = local_60;
    std::__cxx11::string::string(local_30,(string *)&local_50);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string(local_30);
  if (cVar1 == '\0') {
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }